

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_aead_encrypt(psa_key_handle_t handle,psa_algorithm_t alg,uint8_t *nonce,size_t nonce_length,
                uint8_t *additional_data,size_t additional_data_length,uint8_t *plaintext,
                size_t plaintext_length,uint8_t *ciphertext,size_t ciphertext_size,
                size_t *ciphertext_length)

{
  int iVar1;
  psa_status_t pVar2;
  uchar *tag_00;
  uint8_t *tag;
  aead_operation_t operation;
  psa_status_t status;
  size_t additional_data_length_local;
  uint8_t *additional_data_local;
  size_t nonce_length_local;
  uint8_t *nonce_local;
  psa_algorithm_t alg_local;
  psa_key_handle_t handle_local;
  
  *ciphertext_length = 0;
  operation._444_4_ = psa_aead_setup((aead_operation_t *)&tag,handle,0x100,alg);
  if (operation._444_4_ != 0) {
    return operation._444_4_;
  }
  if (ciphertext_size < plaintext_length + (byte)operation.ctx._421_1_) {
    operation.full_tag_length = 'v';
    operation.tag_length = 0xff;
    operation._446_2_ = 0xffff;
  }
  else {
    tag_00 = ciphertext + plaintext_length;
    if (operation.ctx.gcm.mode == 0x6401002) {
      iVar1 = mbedtls_gcm_crypt_and_tag
                        ((mbedtls_gcm_context *)&operation.cipher_info,1,plaintext_length,nonce,
                         nonce_length,additional_data,additional_data_length,plaintext,ciphertext,
                         (ulong)(byte)operation.ctx._421_1_,tag_00);
      operation._444_4_ = mbedtls_to_psa_error(iVar1);
    }
    else if (operation.ctx.gcm.mode == 0x6401001) {
      iVar1 = mbedtls_ccm_encrypt_and_tag
                        ((mbedtls_ccm_context *)&operation.cipher_info,plaintext_length,nonce,
                         nonce_length,additional_data,additional_data_length,plaintext,ciphertext,
                         tag_00,(ulong)(byte)operation.ctx._421_1_);
      operation._444_4_ = mbedtls_to_psa_error(iVar1);
    }
    else {
      if (operation.ctx.gcm.mode != 0x6001005) {
        return -0x86;
      }
      if ((nonce_length != 0xc) || (operation.ctx._421_1_ != '\x10')) {
        operation.full_tag_length = 'z';
        operation.tag_length = 0xff;
        operation._446_2_ = 0xffff;
        goto LAB_00139634;
      }
      iVar1 = mbedtls_chachapoly_encrypt_and_tag
                        ((mbedtls_chachapoly_context *)&operation.cipher_info,plaintext_length,nonce
                         ,additional_data,additional_data_length,plaintext,ciphertext,tag_00);
      operation._444_4_ = mbedtls_to_psa_error(iVar1);
    }
    if ((operation._444_4_ != 0) && (ciphertext_size != 0)) {
      memset(ciphertext,0,ciphertext_size);
    }
  }
LAB_00139634:
  psa_aead_abort_internal((aead_operation_t *)&tag);
  if (operation._444_4_ == 0) {
    *ciphertext_length = plaintext_length + (byte)operation.ctx._421_1_;
  }
  pVar2._0_1_ = operation.full_tag_length;
  pVar2._1_1_ = operation.tag_length;
  pVar2._2_2_ = operation._446_2_;
  return pVar2;
}

Assistant:

psa_status_t psa_aead_encrypt( psa_key_handle_t handle,
                               psa_algorithm_t alg,
                               const uint8_t *nonce,
                               size_t nonce_length,
                               const uint8_t *additional_data,
                               size_t additional_data_length,
                               const uint8_t *plaintext,
                               size_t plaintext_length,
                               uint8_t *ciphertext,
                               size_t ciphertext_size,
                               size_t *ciphertext_length )
{
    psa_status_t status;
    aead_operation_t operation;
    uint8_t *tag;

    *ciphertext_length = 0;

    status = psa_aead_setup( &operation, handle, PSA_KEY_USAGE_ENCRYPT, alg );
    if( status != PSA_SUCCESS )
        return( status );

    /* For all currently supported modes, the tag is at the end of the
     * ciphertext. */
    if( ciphertext_size < ( plaintext_length + operation.tag_length ) )
    {
        status = PSA_ERROR_BUFFER_TOO_SMALL;
        goto exit;
    }
    tag = ciphertext + plaintext_length;

#if defined(MBEDTLS_GCM_C)
    if( operation.core_alg == PSA_ALG_GCM )
    {
        status = mbedtls_to_psa_error(
            mbedtls_gcm_crypt_and_tag( &operation.ctx.gcm,
                                       MBEDTLS_GCM_ENCRYPT,
                                       plaintext_length,
                                       nonce, nonce_length,
                                       additional_data, additional_data_length,
                                       plaintext, ciphertext,
                                       operation.tag_length, tag ) );
    }
    else
#endif /* MBEDTLS_GCM_C */
#if defined(MBEDTLS_CCM_C)
    if( operation.core_alg == PSA_ALG_CCM )
    {
        status = mbedtls_to_psa_error(
            mbedtls_ccm_encrypt_and_tag( &operation.ctx.ccm,
                                         plaintext_length,
                                         nonce, nonce_length,
                                         additional_data,
                                         additional_data_length,
                                         plaintext, ciphertext,
                                         tag, operation.tag_length ) );
    }
    else
#endif /* MBEDTLS_CCM_C */
#if defined(MBEDTLS_CHACHAPOLY_C)
    if( operation.core_alg == PSA_ALG_CHACHA20_POLY1305 )
    {
        if( nonce_length != 12 || operation.tag_length != 16 )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        status = mbedtls_to_psa_error(
            mbedtls_chachapoly_encrypt_and_tag( &operation.ctx.chachapoly,
                                                plaintext_length,
                                                nonce,
                                                additional_data,
                                                additional_data_length,
                                                plaintext,
                                                ciphertext,
                                                tag ) );
    }
    else
#endif /* MBEDTLS_CHACHAPOLY_C */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }

    if( status != PSA_SUCCESS && ciphertext_size != 0 )
        memset( ciphertext, 0, ciphertext_size );

exit:
    psa_aead_abort_internal( &operation );
    if( status == PSA_SUCCESS )
        *ciphertext_length = plaintext_length + operation.tag_length;
    return( status );
}